

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::
RegisterTests(ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type sVar2;
  pointer pcVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_>_>
  _Var4;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge> *pPVar5;
  char *pcVar6;
  char *pcVar7;
  _Alloc_hider _Var8;
  char *value_param;
  byte bVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  long *plVar13;
  long *plVar14;
  undefined8 *puVar15;
  ostream *poVar16;
  size_t sVar17;
  const_iterator cVar18;
  int *piVar19;
  undefined4 extraout_var;
  undefined4 *puVar20;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  pointer psVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  element_type *peVar25;
  pointer pIVar26;
  bool bVar27;
  string param_name;
  string test_suite_name;
  ParamGenerator<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
  generator;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_348;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge> *local_340;
  element_type *local_338;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_330;
  long *local_328;
  char *local_320;
  string local_318;
  size_t local_2f8;
  char *local_2f0;
  undefined8 local_2e8;
  char local_2e0 [16];
  long *local_2d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2c8;
  pointer local_2c0;
  pointer local_2b8;
  ParamNameGeneratorFunc *local_2b0;
  char *local_2a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a0;
  CodeLocation local_270;
  char *local_248;
  char local_238 [16];
  string local_228;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined8 local_1e8;
  CodeLocation local_1e0;
  ostream *local_1b8 [2];
  ostream local_1a8 [16];
  _Head_base<0UL,_const_libaom_test::CodecFactory_*,_false> local_198;
  size_t local_190;
  ios_base local_138 [264];
  
  psVar21 = (this->tests_).
            super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_340 = this;
  if (psVar21 !=
      (this->tests_).
      super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar10 = false;
    do {
      peVar25 = (psVar21->
                super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_330 = (psVar21->
                  super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount._M_pi;
      if (local_330 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_330->_M_use_count = local_330->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_330->_M_use_count = local_330->_M_use_count + 1;
        }
      }
      pIVar26 = (local_340->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_338 = peVar25;
      local_2c0 = psVar21;
      if (pIVar26 !=
          (local_340->instantiations_).
          super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          (*pIVar26->generator)(&local_2d0);
          local_2b0 = pIVar26->name_func;
          local_320 = pIVar26->file;
          iVar12 = pIVar26->line;
          local_2f0 = local_2e0;
          local_2e8 = 0;
          local_2e0[0] = '\0';
          sVar2 = (pIVar26->name)._M_string_length;
          if (sVar2 != 0) {
            local_1b8[0] = local_1a8;
            pcVar3 = (pIVar26->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>((string *)local_1b8,pcVar3,pcVar3 + sVar2);
            std::__cxx11::string::append((char *)local_1b8);
            std::__cxx11::string::operator=((string *)&local_2f0,(string *)local_1b8);
            if (local_1b8[0] != local_1a8) {
              operator_delete(local_1b8[0]);
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_2f0,(ulong)(peVar25->test_suite_base_name)._M_dataplus._M_p);
          local_2a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_2a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_2a0._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_2a0._M_impl.super__Rb_tree_header._M_header;
          local_2a0._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_2b8 = pIVar26;
          local_2a0._M_impl.super__Rb_tree_header._M_header._M_right =
               local_2a0._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar13 = (long *)(**(code **)(*local_2d0 + 0x10))();
          local_2f8 = 0;
          local_328 = plVar13;
          while( true ) {
            plVar14 = (long *)(**(code **)(*local_2d0 + 0x18))();
            if (plVar13 == plVar14) {
              bVar9 = 0;
            }
            else {
              bVar9 = (**(code **)(*plVar13 + 0x30))(plVar13,plVar14);
              bVar9 = bVar9 ^ 1;
            }
            if (plVar14 != (long *)0x0) {
              (**(code **)(*plVar14 + 8))(plVar14);
            }
            if (bVar9 == 0) break;
            Message::Message((Message *)&local_348);
            puVar15 = (undefined8 *)(**(code **)(*plVar13 + 0x28))(plVar13);
            local_198._M_head_impl = (CodecFactory *)puVar15[4];
            local_1b8[0] = (ostream *)*puVar15;
            local_1b8[1] = (ostream *)puVar15[1];
            local_1a8._0_8_ = puVar15[2];
            local_1a8._8_8_ = puVar15[3];
            local_190 = local_2f8;
            (*local_2b0)(&local_318,
                         (TestParamInfo<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>
                          *)local_1b8);
            _Var8._M_p = local_318._M_dataplus._M_p;
            if (local_318._M_string_length == 0) {
              bVar10 = false;
            }
            else {
              lVar22 = local_318._M_string_length - 1;
              lVar24 = 0;
              do {
                uVar23 = (uint)(byte)_Var8._M_p[lVar24];
                iVar11 = isalnum(uVar23);
                bVar10 = iVar11 != 0 || uVar23 == 0x5f;
                if (iVar11 == 0 && uVar23 != 0x5f) break;
                bVar27 = lVar22 != lVar24;
                lVar24 = lVar24 + 1;
              } while (bVar27);
            }
            bVar10 = IsTrue(bVar10);
            if (!bVar10) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x246);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                         0x2f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_318._M_dataplus._M_p,
                                   local_318._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\' is invalid, in ",0x11);
              pcVar6 = local_320;
              if (local_320 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar17 = strlen(local_320);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar6,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," line ",6);
              plVar14 = (long *)std::ostream::operator<<(poVar16,iVar12);
              std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
              std::ostream::put((char)plVar14);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            cVar18 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_2a0,&local_318);
            bVar10 = IsTrue((_Rb_tree_header *)cVar18._M_node ==
                            &local_2a0._M_impl.super__Rb_tree_header);
            if (!bVar10) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-param-util.h"
                                 ,0x24a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
              poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,local_318._M_dataplus._M_p,
                                   local_318._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\', in ",6);
              pcVar6 = local_320;
              if (local_320 == (char *)0x0) {
                std::ios::clear((int)poVar16 + (int)*(undefined8 *)(*(long *)poVar16 + -0x18));
              }
              else {
                sVar17 = strlen(local_320);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar6,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar16," line ",6);
              plVar14 = (long *)std::ostream::operator<<(poVar16,iVar12);
              std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
              std::ostream::put((char)plVar14);
              std::ostream::flush();
              GTestLog::~GTestLog((GTestLog *)local_1b8);
            }
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string_const&>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_2a0,&local_318);
            sVar2 = (local_338->test_base_name)._M_string_length;
            if (sVar2 != 0) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_348._M_head_impl + 0x10),
                         (local_338->test_base_name)._M_dataplus._M_p,sVar2);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_348._M_head_impl + 0x10),"/",1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)(local_348._M_head_impl + 0x10),local_318._M_dataplus._M_p,
                       local_318._M_string_length);
            pcVar6 = local_2f0;
            Message::GetString_abi_cxx11_(&local_228,(Message *)&local_348);
            local_2a8 = local_228._M_dataplus._M_p;
            piVar19 = (int *)(**(code **)(*plVar13 + 0x28))(plVar13);
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"(",1);
            PointerPrinter::PrintValue<libaom_test::CodecFactory_const>
                      (*(CodecFactory **)(piVar19 + 8),local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"AltRefTestParams { min_kf_dist:",0x1f);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," max_kf_dist:",0xd);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," min_gf_interval:",0x11);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," max_gf_interval:",0x11);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," lag_in_frames:",0xf);
            poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," encoding_mode:",0xf);
            poVar16 = (ostream *)std::ostream::operator<<(poVar16,piVar19[6]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16," }",2);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,", ",2);
            std::ostream::operator<<(local_1a8,*piVar19);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
            std::__cxx11::stringbuf::str();
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(local_138);
            value_param = local_248;
            peVar25 = local_338;
            local_270.file._M_dataplus._M_p = (pointer)&local_270.file.field_2;
            pcVar3 = (local_338->code_location).file._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_270,pcVar3,
                       pcVar3 + (local_338->code_location).file._M_string_length);
            local_270.line = (peVar25->code_location).line;
            iVar11 = (*(local_340->super_ParameterizedTestSuiteInfoBase).
                       _vptr_ParameterizedTestSuiteInfoBase[3])();
            bVar10 = IsTrue(true);
            if (!bVar10) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x20e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                         ,0x6a);
              pcVar7 = local_320;
              if (local_320 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar17 = strlen(local_320);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,iVar12);
              GTestLog::~GTestLog((GTestLog *)local_1b8);
              plVar13 = local_328;
            }
            bVar10 = IsTrue(true);
            if (!bVar10) {
              GTestLog::GTestLog((GTestLog *)local_1b8,GTEST_FATAL,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/third_party/googletest/src/googletest/include/gtest/internal/gtest-internal.h"
                                 ,0x223);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",
                         0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,
                         "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                         ,0x6f);
              pcVar7 = local_320;
              if (local_320 == (char *)0x0) {
                std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10f0768);
              }
              else {
                sVar17 = strlen(local_320);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,pcVar7,sVar17);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
              std::ostream::operator<<(&std::cerr,iVar12);
              GTestLog::~GTestLog((GTestLog *)local_1b8);
              plVar13 = local_328;
            }
            _Var4.
            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_*,_false>
            ._M_head_impl =
                 (local_338->test_meta_factory)._M_t.
                 super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_>_>
                 .
                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_*,_false>
            ;
            puVar20 = (undefined4 *)(**(code **)(*plVar13 + 0x28))(plVar13);
            local_1e8 = *(undefined8 *)(puVar20 + 8);
            local_208 = *puVar20;
            uStack_204 = puVar20[1];
            uStack_200 = puVar20[2];
            uStack_1fc = puVar20[3];
            local_1f8 = puVar20[4];
            uStack_1f4 = puVar20[5];
            uStack_1f0 = puVar20[6];
            uStack_1ec = puVar20[7];
            factory = (TestFactoryBase *)
                      (**(code **)(*(long *)_Var4.
                                            super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_*,_false>
                                            ._M_head_impl + 0x10))
                                (_Var4.
                                 super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::AltRefTestParams,_aom_rc_mode>_>_*,_false>
                                 ._M_head_impl,&local_208);
            MakeAndRegisterTestInfo
                      (pcVar6,local_2a8,(char *)0x0,value_param,&local_270,
                       (TypeId)CONCAT44(extraout_var,iVar11),(SetUpTestSuiteFunc)0x0,
                       (TearDownTestSuiteFunc)0x0,factory);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_270.file._M_dataplus._M_p != &local_270.file.field_2) {
              operator_delete(local_270.file._M_dataplus._M_p);
            }
            if (local_248 != local_238) {
              operator_delete(local_248);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_318._M_dataplus._M_p != &local_318.field_2) {
              operator_delete(local_318._M_dataplus._M_p);
            }
            if (local_348._M_head_impl !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              (**(code **)(*(long *)local_348._M_head_impl + 8))();
            }
            (**(code **)(*plVar13 + 0x18))(plVar13);
            local_2f8 = local_2f8 + 1;
            bVar10 = true;
          }
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 8))(plVar13);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_2a0);
          if (local_2f0 != local_2e0) {
            operator_delete(local_2f0);
          }
          pIVar26 = local_2b8;
          peVar25 = local_338;
          if (local_2c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8);
          }
          pIVar26 = pIVar26 + 1;
        } while (pIVar26 !=
                 (local_340->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      if (local_330 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_330);
      }
      psVar21 = local_2c0 + 1;
    } while (psVar21 !=
             (local_340->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar10) {
      return;
    }
  }
  pPVar5 = local_340;
  iVar12 = (*(local_340->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase
             [2])(local_340);
  paVar1 = &local_1e0.file.field_2;
  pcVar3 = (pPVar5->code_location_).file._M_dataplus._M_p;
  local_1e0.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,pcVar3,pcVar3 + (pPVar5->code_location_).file._M_string_length);
  local_1e0.line = (pPVar5->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar12),&local_1e0,
             (pPVar5->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (pPVar5->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::AltRefFramePresenceTestLarge>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0.file._M_dataplus._M_p);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    for (typename TestInfoContainer::iterator test_it = tests_.begin();
         test_it != tests_.end(); ++test_it) {
      std::shared_ptr<TestInfo> test_info = *test_it;
      for (typename InstantiationContainer::iterator gen_it =
               instantiations_.begin();
           gen_it != instantiations_.end(); ++gen_it) {
        const std::string& instantiation_name = gen_it->name;
        ParamGenerator<ParamType> generator((*gen_it->generator)());
        ParamNameGeneratorFunc* name_func = gen_it->name_func;
        const char* file = gen_it->file;
        int line = gen_it->line;

        std::string test_suite_name;
        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        test_suite_name += test_info->test_suite_base_name;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (typename ParamGenerator<ParamType>::iterator param_it =
                 generator.begin();
             param_it != generator.end(); ++param_it, ++i) {
          generated_instantiations = true;

          Message test_name_stream;

          std::string param_name =
              name_func(TestParamInfo<ParamType>(*param_it, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid, in " << file << " line " << line << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          test_param_names.insert(param_name);

          if (!test_info->test_base_name.empty()) {
            test_name_stream << test_info->test_base_name << "/";
          }
          test_name_stream << param_name;
          MakeAndRegisterTestInfo(
              test_suite_name.c_str(), test_name_stream.GetString().c_str(),
              nullptr,  // No type parameter.
              PrintToString(*param_it).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(*param_it));
        }  // for param_it
      }    // for gen_it
    }      // for test_it

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }